

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

char * libtorrent::name_for_setting(int s)

{
  dword *pdVar1;
  
  switch((uint)s >> 0xe & 3) {
  case 0:
    pdVar1 = (dword *)(&(anonymous_namespace)::str_settings + (long)s * 7);
    break;
  case 1:
    pdVar1 = &DWORD_0044e200 + (long)s * 8;
    break;
  case 2:
    pdVar1 = (dword *)(BYTE_ARRAY_003cf5b9 + (long)s * 0x20 + 0x27);
    break;
  case 3:
    return "";
  }
  return *(char **)pdVar1;
}

Assistant:

char const* name_for_setting(int s)
	{
		switch (s & settings_pack::type_mask)
		{
			case settings_pack::string_type_base:
				return str_settings[s - settings_pack::string_type_base].name;
			case settings_pack::int_type_base:
				return int_settings[s - settings_pack::int_type_base].name;
			case settings_pack::bool_type_base:
				return bool_settings[s - settings_pack::bool_type_base].name;
		}
		return "";
	}